

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpinternalsourcedata.h
# Opt level: O0

int __thiscall
jrtplib::RTPInternalSourceData::SetRTCPDataAddress(RTPInternalSourceData *this,RTPAddress *a)

{
  RTPAddress *pRVar1;
  int iVar2;
  RTPMemoryManager *pRVar3;
  undefined4 extraout_var;
  RTPAddress *newaddr;
  RTPAddress *a_local;
  RTPInternalSourceData *this_local;
  
  if (a == (RTPAddress *)0x0) {
    if ((this->super_RTPSourceData).rtcpaddr != (RTPAddress *)0x0) {
      pRVar1 = (this->super_RTPSourceData).rtcpaddr;
      pRVar3 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
      RTPDelete<jrtplib::RTPAddress>(pRVar1,pRVar3);
      (this->super_RTPSourceData).rtcpaddr = (RTPAddress *)0x0;
    }
  }
  else {
    pRVar3 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    iVar2 = (**a->_vptr_RTPAddress)(a,pRVar3);
    if ((RTPAddress *)CONCAT44(extraout_var,iVar2) == (RTPAddress *)0x0) {
      return -1;
    }
    if (((this->super_RTPSourceData).rtcpaddr != (RTPAddress *)0x0) &&
       (a != (this->super_RTPSourceData).rtcpaddr)) {
      pRVar1 = (this->super_RTPSourceData).rtcpaddr;
      pRVar3 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
      RTPDelete<jrtplib::RTPAddress>(pRVar1,pRVar3);
    }
    (this->super_RTPSourceData).rtcpaddr = (RTPAddress *)CONCAT44(extraout_var,iVar2);
  }
  (this->super_RTPSourceData).isrtcpaddrset = true;
  return 0;
}

Assistant:

inline int RTPInternalSourceData::SetRTCPDataAddress(const RTPAddress *a)
{
	if (a == 0)
	{
		if (rtcpaddr)
		{
			RTPDelete(rtcpaddr,GetMemoryManager());
			rtcpaddr = 0;
		}
	}
	else
	{
		RTPAddress *newaddr = a->CreateCopy(GetMemoryManager());
		if (newaddr == 0)
			return ERR_RTP_OUTOFMEM;
		
		if (rtcpaddr && a != rtcpaddr)
			RTPDelete(rtcpaddr,GetMemoryManager());
		rtcpaddr = newaddr;
	}
	isrtcpaddrset = true;
	return 0;
}